

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_string.c
# Opt level: O0

HPDF_STATUS HPDF_String_Write(HPDF_String obj,HPDF_Stream_conflict stream,HPDF_Encrypt e)

{
  HPDF_BYTE *data;
  HPDF_UINT len_00;
  HPDF_ByteType HVar1;
  HPDF_STATUS HVar2;
  HPDF_UINT16 char_code;
  HPDF_BYTE b2;
  HPDF_ByteType btype;
  HPDF_UNICODE tmp_unicode;
  HPDF_BYTE b;
  HPDF_UINT i;
  HPDF_ParseText_Rec parse_state;
  HPDF_BYTE *pHStack_248;
  HPDF_INT32 len;
  HPDF_BYTE *pbuf;
  HPDF_BYTE local_238 [4];
  HPDF_UINT tmp_len;
  HPDF_BYTE buf [512];
  HPDF_BYTE *src;
  HPDF_STATUS ret;
  HPDF_Encrypt e_local;
  HPDF_Stream_conflict stream_local;
  HPDF_String obj_local;
  
  if (e != (HPDF_Encrypt)0x0) {
    HPDF_Encrypt_Reset(e);
  }
  if (obj->encoder == (HPDF_Encoder_conflict)0x0) {
    if (e == (HPDF_Encrypt)0x0) {
      obj_local = (HPDF_String)HPDF_Stream_WriteEscapeText(stream,(char *)obj->value);
    }
    else {
      obj_local = (HPDF_String)HPDF_Stream_WriteChar(stream,'<');
      if (obj_local == (HPDF_String)0x0) {
        data = obj->value;
        len_00 = HPDF_StrLen((char *)obj->value,-1);
        obj_local = (HPDF_String)HPDF_Stream_WriteBinary(stream,data,len_00,e);
        if (obj_local == (HPDF_String)0x0) {
          obj_local = (HPDF_String)HPDF_Stream_WriteChar(stream,'>');
        }
      }
    }
  }
  else {
    buf._504_8_ = obj->value;
    pbuf._4_4_ = 0;
    pHStack_248 = local_238;
    parse_state._20_4_ = obj->len;
    obj_local = (HPDF_String)HPDF_Stream_WriteChar(stream,'<');
    if ((obj_local == (HPDF_String)0x0) &&
       (obj_local = (HPDF_String)HPDF_Stream_WriteBinary(stream,UNICODE_HEADER,2,e),
       obj_local == (HPDF_String)0x0)) {
      HPDF_Encoder_SetParseText
                (obj->encoder,(HPDF_ParseText_Rec *)&tmp_unicode,(HPDF_BYTE *)buf._504_8_,
                 parse_state._20_4_);
      for (btype = HPDF_BYTE_TYPE_SINGLE; (int)btype < (int)parse_state._20_4_;
          btype = btype + HPDF_BYTE_TYPE_LEAD) {
        b2 = *(HPDF_BYTE *)(buf._504_8_ + (ulong)btype);
        HVar1 = HPDF_Encoder_ByteType(obj->encoder,(HPDF_ParseText_Rec *)&tmp_unicode);
        if (0xfe < pbuf._4_4_) {
          HVar2 = HPDF_Stream_WriteBinary(stream,local_238,pbuf._4_4_ << 1,e);
          if (HVar2 != 0) {
            return HVar2;
          }
          pbuf._4_4_ = 0;
          pHStack_248 = local_238;
        }
        if (HVar1 != HPDF_BYTE_TYPE_TRAIL) {
          if (HVar1 == HPDF_BYTE_TYPE_LEAD) {
            char_code = HPDF_Encoder_ToUnicode
                                  (obj->encoder,
                                   (ushort)b2 * 0x100 +
                                   (ushort)*(byte *)(buf._504_8_ +
                                                    (ulong)(btype + HPDF_BYTE_TYPE_LEAD)));
          }
          else {
            char_code = HPDF_Encoder_ToUnicode(obj->encoder,(ushort)b2);
          }
          HPDF_UInt16Swap(&char_code);
          HPDF_MemCpy(pHStack_248,(HPDF_BYTE *)&char_code,2);
          pHStack_248 = pHStack_248 + 2;
          pbuf._4_4_ = pbuf._4_4_ + 1;
        }
      }
      if (((pbuf._4_4_ == 0) ||
          (obj_local = (HPDF_String)HPDF_Stream_WriteBinary(stream,local_238,pbuf._4_4_ << 1,e),
          obj_local == (HPDF_String)0x0)) &&
         (obj_local = (HPDF_String)HPDF_Stream_WriteChar(stream,'>'), obj_local == (HPDF_String)0x0)
         ) {
        obj_local = (HPDF_String)0x0;
      }
    }
  }
  return (HPDF_STATUS)obj_local;
}

Assistant:

HPDF_STATUS
HPDF_String_Write  (HPDF_String   obj,
                    HPDF_Stream   stream,
                    HPDF_Encrypt  e)
{
    HPDF_STATUS ret;

    /*
     *  When encoder is not NULL, text is changed to unicode using encoder,
     *  and it outputs by HPDF_write_binary method.
     */

    HPDF_PTRACE((" HPDF_String_Write\n"));

    if (e)
        HPDF_Encrypt_Reset (e);

    if (obj->encoder == NULL) {
        if (e) {
            if ((ret = HPDF_Stream_WriteChar (stream, '<')) != HPDF_OK)
                return ret;

            if ((ret = HPDF_Stream_WriteBinary (stream, obj->value,
                    HPDF_StrLen ((char *)obj->value, -1), e)) != HPDF_OK)
                return ret;

            return HPDF_Stream_WriteChar (stream, '>');
        } else {
            return HPDF_Stream_WriteEscapeText (stream, (char *)obj->value);
        }
    } else {
        HPDF_BYTE* src = obj->value;
        HPDF_BYTE buf[HPDF_TEXT_DEFAULT_LEN * 2];
        HPDF_UINT tmp_len = 0;
        HPDF_BYTE* pbuf = buf;
        HPDF_INT32 len = obj->len;
        HPDF_ParseText_Rec  parse_state;
        HPDF_UINT i;

        if ((ret = HPDF_Stream_WriteChar (stream, '<')) != HPDF_OK)
           return ret;

        if ((ret = HPDF_Stream_WriteBinary (stream, UNICODE_HEADER, 2, e))
                        != HPDF_OK)
            return ret;

        HPDF_Encoder_SetParseText (obj->encoder, &parse_state, src, len);

        for (i = 0; (HPDF_INT32)i < len; i++) {
            HPDF_BYTE b = src[i];
            HPDF_UNICODE tmp_unicode;
            HPDF_ByteType btype = HPDF_Encoder_ByteType (obj->encoder,
                    &parse_state);

            if (tmp_len >= HPDF_TEXT_DEFAULT_LEN - 1) {
                if ((ret = HPDF_Stream_WriteBinary (stream, buf,
                            tmp_len * 2, e)) != HPDF_OK)
                    return ret;

                tmp_len = 0;
                pbuf = buf;
            }

            if (btype != HPDF_BYTE_TYPE_TRAIL) {
                if (btype == HPDF_BYTE_TYPE_LEAD) {
                    HPDF_BYTE b2 = src[i + 1];
                    HPDF_UINT16 char_code = (HPDF_UINT16)((HPDF_UINT) b * 256 + b2);

                    tmp_unicode = HPDF_Encoder_ToUnicode (obj->encoder,
                                char_code);
                } else {
                    tmp_unicode = HPDF_Encoder_ToUnicode (obj->encoder, b);
                }

                HPDF_UInt16Swap (&tmp_unicode);
                HPDF_MemCpy (pbuf, (HPDF_BYTE*)&tmp_unicode, 2);
                pbuf += 2;
                tmp_len++;
            }
        }

        if (tmp_len > 0) {
            if ((ret = HPDF_Stream_WriteBinary (stream, buf, tmp_len * 2, e))
                            != HPDF_OK)
                return ret;
        }

        if ((ret = HPDF_Stream_WriteChar (stream, '>')) != HPDF_OK)
            return ret;
    }

    return HPDF_OK;
}